

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::ReadStream<double>(double *data_to_read,istream *input_stream)

{
  ulong uVar1;
  long lVar2;
  char *in_RSI;
  long in_RDI;
  int type_byte;
  byte local_1d;
  
  if (((in_RDI != 0) && (in_RSI != (char *)0x0)) && (uVar1 = std::ios::eof(), (uVar1 & 1) == 0)) {
    std::istream::read(in_RSI,in_RDI);
    lVar2 = std::istream::gcount();
    if (lVar2 == 8) {
      local_1d = std::ios::fail();
      local_1d = local_1d ^ 0xff;
    }
    else {
      local_1d = 0;
    }
    return (bool)(local_1d & 1);
  }
  return false;
}

Assistant:

bool ReadStream(T* data_to_read, std::istream* input_stream) {
  if (NULL == data_to_read || NULL == input_stream || input_stream->eof()) {
    return false;
  }

  const int type_byte(sizeof(*data_to_read));
  input_stream->read(reinterpret_cast<char*>(data_to_read), type_byte);

  return (type_byte == input_stream->gcount()) ? !input_stream->fail() : false;
}